

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O2

Usage __thiscall
de::Random::
chooseWeighted<deqp::gls::DrawTestSpec::Usage,deqp::gls::DrawTestSpec::Usage_const*,float_const*>
          (Random *this,Usage *first,Usage *last,float *weight)

{
  Usage *pUVar1;
  int iVar2;
  Usage *pUVar3;
  Usage *pUVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar5 = 0.0;
  for (iVar2 = 0; first + iVar2 != last; iVar2 = iVar2 + 1) {
    fVar5 = fVar5 + weight[iVar2];
  }
  fVar6 = deRandom_getFloat(&this->m_rnd);
  iVar2 = 0;
  fVar7 = 0.0;
  pUVar3 = last;
  while( true ) {
    pUVar1 = first + iVar2;
    pUVar4 = pUVar3;
    if (pUVar1 == last) break;
    fVar7 = fVar7 + weight[iVar2];
    pUVar4 = pUVar1;
    if (fVar5 * fVar6 + 0.0 < fVar7) break;
    if (0.0 < weight[iVar2]) {
      pUVar3 = pUVar1;
    }
    iVar2 = iVar2 + 1;
  }
  return *pUVar4;
}

Assistant:

T Random::chooseWeighted (InputIter first, InputIter last, WeightIter weight)
{
	// Compute weight sum
	float	weightSum	= 0.0f;
	int		ndx;
	for (ndx = 0; (first + ndx) != last; ndx++)
		weightSum += *(weight + ndx);

	// Random point in 0..weightSum
	float p = getFloat(0.0f, weightSum);

	// Find item in range
	InputIter	lastNonZero	= last;
	float		curWeight	= 0.0f;
	for (ndx = 0; (first + ndx) != last; ndx++)
	{
		float w = *(weight + ndx);

		curWeight += w;

		if (p < curWeight)
			return *(first + ndx);
		else if (w > 0.0f)
			lastNonZero = first + ndx;
	}

	DE_ASSERT(lastNonZero != last);
	return *lastNonZero;
}